

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

bool __thiscall sf::Texture::create(Texture *this,uint width,uint height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  Uint64 UVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Vector2u VVar10;
  TransientContextLock lock;
  TextureSaver save;
  GLuint texture;
  
  if (width == 0 || height == 0) {
    poVar5 = err();
    poVar5 = std::operator<<(poVar5,"Failed to create texture, invalid size (");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"x");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar7 = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::ensureExtensionsInit();
    uVar1 = getValidSize(width);
    uVar2 = getValidSize(height);
    uVar3 = getMaximumSize();
    bVar7 = uVar2 <= uVar3 && uVar1 <= uVar3;
    if (uVar2 <= uVar3 && uVar1 <= uVar3) {
      (this->m_size).x = width;
      (this->m_size).y = height;
      VVar10.y = uVar2;
      VVar10.x = uVar1;
      this->m_actualSize = VVar10;
      this->m_pixelsFlipped = false;
      this->m_fboAttachment = false;
      if (this->m_texture == 0) {
        glGenTextures(1,&texture);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0xa2,"glGenTextures(1, &texture)");
        this->m_texture = texture;
      }
      priv::TextureSaver::TextureSaver(&save);
      if (create(unsigned_int,unsigned_int)::textureEdgeClamp == '\0') {
        iVar4 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureEdgeClamp);
        if (iVar4 != 0) {
          create::textureEdgeClamp =
               sfogl_ext_EXT_texture_edge_clamp != 0 || sfogl_ext_SGIS_texture_edge_clamp != 0;
          __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureEdgeClamp);
        }
      }
      if (((this->m_isRepeated == false) && (create::textureEdgeClamp == false)) &&
         (create(unsigned_int,unsigned_int)::warned == '\0')) {
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,"OpenGL extension SGIS_texture_edge_clamp unavailable");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,"Artifacts may occur along texture edges");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,"Ensure that hardware acceleration is enabled if available")
        ;
        std::endl<char,std::char_traits<char>>(poVar5);
        create(unsigned_int,unsigned_int)::warned = '\x01';
      }
      if (create(unsigned_int,unsigned_int)::textureSrgb == '\0') {
        iVar4 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureSrgb);
        if (iVar4 != 0) {
          create::textureSrgb = sfogl_ext_EXT_texture_sRGB != 0;
          __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureSrgb);
        }
      }
      if ((this->m_sRgb == true) && (create::textureSrgb == false)) {
        if (create(unsigned_int,unsigned_int)::warned == '\0') {
          poVar5 = err();
          poVar5 = std::operator<<(poVar5,"OpenGL extension EXT_texture_sRGB unavailable");
          std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = err();
          poVar5 = std::operator<<(poVar5,"Automatic sRGB to linear conversion disabled");
          std::endl<char,std::char_traits<char>>(poVar5);
          create(unsigned_int,unsigned_int)::warned = '\x01';
        }
        this->m_sRgb = false;
      }
      glBindTexture(0xde1,this->m_texture);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xcf,"glBindTexture(GL_TEXTURE_2D, m_texture)");
      uVar8 = 0x1908;
      if (this->m_sRgb != false) {
        uVar8 = 0x8c43;
      }
      glTexImage2D(0xde1,0,uVar8,(this->m_actualSize).x,(this->m_actualSize).y,0,0x1908,0x1401,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd0,
                         "glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), m_actualSize.x, m_actualSize.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL)"
                        );
      uVar8 = 0x2900;
      if ((create::textureEdgeClamp & 1U) != 0) {
        uVar8 = 0x812f;
      }
      uVar9 = 0x2901;
      if (this->m_isRepeated == false) {
        uVar9 = uVar8;
      }
      glTexParameteri(0xde1,0x2802,uVar9);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd1,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                        );
      uVar8 = 0x2900;
      if ((create::textureEdgeClamp & 1U) != 0) {
        uVar8 = 0x812f;
      }
      uVar9 = 0x2901;
      if (this->m_isRepeated == false) {
        uVar9 = uVar8;
      }
      glTexParameteri(0xde1,0x2803,uVar9);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd2,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                        );
      glTexParameteri(0xde1,0x2800,this->m_isSmooth | 0x2600);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd3,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                        );
      glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2600);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd4,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                        );
      UVar6 = anon_unknown.dwarf_f2021::getUniqueId();
      this->m_cacheId = UVar6;
      this->m_hasMipmap = false;
      priv::TextureSaver::~TextureSaver(&save);
    }
    else {
      poVar5 = err();
      poVar5 = std::operator<<(poVar5,"Failed to create texture, its internal size is too high ");
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"x");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,"maximum is ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"x");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    GlResource::TransientContextLock::~TransientContextLock(&lock);
  }
  return bVar7;
}

Assistant:

bool Texture::create(unsigned int width, unsigned int height)
{
    // Check if texture parameters are valid before creating it
    if ((width == 0) || (height == 0))
    {
        err() << "Failed to create texture, invalid size (" << width << "x" << height << ")" << std::endl;
        return false;
    }

    TransientContextLock lock;

    // Make sure that extensions are initialized
    priv::ensureExtensionsInit();

    // Compute the internal texture dimensions depending on NPOT textures support
    Vector2u actualSize(getValidSize(width), getValidSize(height));

    // Check the maximum texture size
    unsigned int maxSize = getMaximumSize();
    if ((actualSize.x > maxSize) || (actualSize.y > maxSize))
    {
        err() << "Failed to create texture, its internal size is too high "
              << "(" << actualSize.x << "x" << actualSize.y << ", "
              << "maximum is " << maxSize << "x" << maxSize << ")"
              << std::endl;
        return false;
    }

    // All the validity checks passed, we can store the new texture settings
    m_size.x        = width;
    m_size.y        = height;
    m_actualSize    = actualSize;
    m_pixelsFlipped = false;
    m_fboAttachment = false;

    // Create the OpenGL texture if it doesn't exist yet
    if (!m_texture)
    {
        GLuint texture;
        glCheck(glGenTextures(1, &texture));
        m_texture = static_cast<unsigned int>(texture);
    }

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_EXT_texture_edge_clamp;

    if (!m_isRepeated && !textureEdgeClamp)
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
            err() << "Artifacts may occur along texture edges" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    static bool textureSrgb = GLEXT_texture_sRGB;

    if (m_sRgb && !textureSrgb)
    {
        static bool warned = false;

        if (!warned)
        {
#ifndef SFML_OPENGL_ES
            err() << "OpenGL extension EXT_texture_sRGB unavailable" << std::endl;
#else
            err() << "OpenGL ES extension EXT_sRGB unavailable" << std::endl;
#endif
            err() << "Automatic sRGB to linear conversion disabled" << std::endl;

            warned = true;
        }

        m_sRgb = false;
    }

    // Initialize the texture
    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), m_actualSize.x, m_actualSize.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    m_cacheId = getUniqueId();

    m_hasMipmap = false;

    return true;
}